

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::reset
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this)

{
  long lVar1;
  long lVar2;
  
  this->m_status = '\0';
  (*this->m_intf->_vptr_ymfm_interface[1])();
  opn_registers_base<true>::reset(&this->m_regs);
  (**this->m_intf->_vptr_ymfm_interface)(this->m_intf,0);
  for (lVar2 = -0x30; lVar2 != 0; lVar2 = lVar2 + 8) {
    lVar1 = *(long *)((long)&this->m_operator[0]._M_t.
                             super___uniq_ptr_impl<ymfm::fm_operator<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
                             .
                             super__Head_base<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<true>_>_*,_false>
                             ._M_head_impl + lVar2);
    *(undefined4 *)(lVar1 + 4) = 0;
    *(undefined2 *)(lVar1 + 8) = 0;
  }
  for (lVar2 = -0xc0; lVar2 != 0; lVar2 = lVar2 + 8) {
    lVar1 = *(long *)(this[1].m_timer_running + lVar2 + -0x18);
    *(undefined4 *)(lVar1 + 8) = 0;
    *(undefined2 *)(lVar1 + 0xc) = 0x3ff;
    *(undefined4 *)(lVar1 + 0x10) = 4;
    *(undefined2 *)(lVar1 + 0x14) = 0;
    *(undefined1 *)(lVar1 + 0x16) = 0;
  }
  return;
}

Assistant:

void fm_engine_base<RegisterType>::reset()
{
	// reset all status bits
	set_reset_status(0, 0xff);

	// register type-specific initialization
	m_regs.reset();

	// explicitly write to the mode register since it has side-effects
	// QUESTION: old cores initialize this to 0x30 -- who is right?
	write(RegisterType::REG_MODE, 0);

	// reset the channels
	for (auto &chan : m_channel)
		chan->reset();

	// reset the operators
	for (auto &op : m_operator)
		op->reset();
}